

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalStructuralDominance.cpp
# Opt level: O3

void wasm::LocalStructuralDominance::LocalStructuralDominance(wasm::Function*,wasm::Module&,wasm::
     LocalStructuralDominance::Mode)::Scanner::doLocalSet(Scanner*,wasm::Expression___
               (Scanner *self,Expression **currp)

{
  _Bit_type *p_Var1;
  ulong uVar2;
  pointer pSVar3;
  uint local_c [2];
  Index index;
  
  if ((*currp)->_id == LocalSetId) {
    local_c[0] = *(uint *)(*currp + 1);
    p_Var1 = (self->localsSet).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar2 = p_Var1[local_c[0] >> 6];
    if ((uVar2 >> ((ulong)local_c[0] & 0x3f) & 1) == 0) {
      p_Var1[local_c[0] >> 6] = uVar2 | 1L << ((byte)local_c[0] & 0x3f);
      pSVar3 = (self->cleanupStack).
               super__Vector_base<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((self->cleanupStack).
          super__Vector_base<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
          ._M_impl.super__Vector_impl_data._M_start != pSVar3) {
        SmallVector<unsigned_int,_5UL>::push_back(pSVar3 + -1,local_c);
      }
    }
    return;
  }
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                ,0x31b,"T *wasm::Expression::cast() [T = wasm::LocalSet]");
}

Assistant:

static void doLocalSet(Scanner* self, Expression** currp) {
      auto index = (*currp)->cast<LocalSet>()->index;
      if (!self->localsSet[index]) {
        // This local is now set until the end of this scope.
        self->localsSet[index] = true;
        // If we are not in the topmost scope, note this for later cleanup.
        if (!self->cleanupStack.empty()) {
          self->cleanupStack.back().push_back(index);
        }
      }
    }